

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O2

Iterator * leveldb::NewMergingIterator(Comparator *comparator,Iterator **children,int n)

{
  Iterator *pIVar1;
  ulong *puVar2;
  CleanupFunction p_Var3;
  ulong uVar4;
  long lVar5;
  
  if (n < 0) {
    __assert_fail("n >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/table/merger.cc"
                  ,0xb5,
                  "Iterator *leveldb::NewMergingIterator(const Comparator *, Iterator **, int)");
  }
  if (n == 1) {
    pIVar1 = *children;
  }
  else {
    if (n == 0) {
      pIVar1 = NewEmptyIterator();
      return pIVar1;
    }
    pIVar1 = (Iterator *)operator_new(0x50);
    Iterator::Iterator(pIVar1);
    pIVar1->_vptr_Iterator = (_func_int **)&PTR__MergingIterator_00173aa0;
    pIVar1[1]._vptr_Iterator = (_func_int **)comparator;
    uVar4 = (ulong)(uint)n;
    puVar2 = (ulong *)operator_new__(uVar4 * 0x20 + 8);
    *puVar2 = uVar4;
    p_Var3 = (CleanupFunction)(puVar2 + 1);
    do {
      *(undefined8 *)p_Var3 = 0;
      p_Var3[8] = (code)0x0;
      *(char **)(p_Var3 + 0x10) = "";
      *(undefined8 *)(p_Var3 + 0x18) = 0;
      p_Var3 = p_Var3 + 0x20;
    } while (p_Var3 != (CleanupFunction)(puVar2 + uVar4 * 4 + 1));
    pIVar1[1].cleanup_head_.function = (CleanupFunction)(puVar2 + 1);
    *(int *)&pIVar1[1].cleanup_head_.arg1 = n;
    pIVar1[1].cleanup_head_.arg2 = (void *)0x0;
    *(undefined4 *)&pIVar1[1].cleanup_head_.next = 0;
    for (lVar5 = 0; uVar4 * 0x20 != lVar5; lVar5 = lVar5 + 0x20) {
      IteratorWrapper::Set((IteratorWrapper *)(pIVar1[1].cleanup_head_.function + lVar5),*children);
      children = children + 1;
    }
  }
  return pIVar1;
}

Assistant:

Iterator* NewMergingIterator(const Comparator* comparator, Iterator** children,
                             int n) {
  assert(n >= 0);
  if (n == 0) {
    return NewEmptyIterator();
  } else if (n == 1) {
    return children[0];
  } else {
    return new MergingIterator(comparator, children, n);
  }
}